

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBox::setPlaceholderText(QComboBox *this,QString *placeholderText)

{
  long lVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  QStringView QVar5;
  QStringView QVar6;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  lVar2 = (placeholderText->d).size;
  if (lVar2 == *(long *)(lVar1 + 0x2d8)) {
    QVar5.m_data = (placeholderText->d).ptr;
    QVar5.m_size = lVar2;
    QVar6.m_data = *(storage_type_conflict **)(lVar1 + 0x2d0);
    QVar6.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar5,QVar6);
    if (cVar3 != '\0') {
      return;
    }
  }
  QString::operator=((QString *)(lVar1 + 0x2c8),(QString *)placeholderText);
  iVar4 = QPersistentModelIndex::row();
  if (iVar4 != -1) {
    QWidget::updateGeometry(&this->super_QWidget);
    return;
  }
  if (*(long *)(lVar1 + 0x2d8) != 0) {
    QWidget::update(&this->super_QWidget);
    return;
  }
  setCurrentIndex(this,0);
  return;
}

Assistant:

void QComboBox::setPlaceholderText(const QString &placeholderText)
{
    Q_D(QComboBox);
    if (placeholderText == d->placeholderText)
        return;

    d->placeholderText = placeholderText;
    if (currentIndex() == -1) {
      if (d->placeholderText.isEmpty())
        setCurrentIndex(0);
      else
        update();
    } else {
      updateGeometry();
    }
}